

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenscanner.cpp
# Opt level: O0

TokenScanner * __thiscall TokenScanner::nextToken_abi_cxx11_(TokenScanner *this)

{
  char cVar1;
  StringCell *pSVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  TokenScanner *in_RSI;
  byte local_c5;
  string local_80 [32];
  string local_60 [34];
  allocator local_3e;
  undefined1 local_3d;
  allocator local_2d;
  int local_2c;
  int local_28;
  int prev;
  int ch;
  StringCell *cp;
  TokenScanner *this_local;
  string *token;
  
  this_local = this;
  if (in_RSI->savedTokens == (StringCell *)0x0) {
LAB_00109e47:
    if ((in_RSI->ignoreWhitespaceFlag & 1U) != 0) {
      skipSpaces(in_RSI);
    }
    local_28 = std::istream::get();
    if ((local_28 != 0x2f) || ((in_RSI->ignoreCommentsFlag & 1U) == 0)) goto LAB_00109f37;
    local_28 = std::istream::get();
    if (local_28 == 0x2f) {
      local_28 = 0x2f;
      do {
        local_28 = std::istream::get();
        if ((local_28 == 10) || (local_28 == 0xd)) break;
      } while (local_28 != -1);
      goto LAB_00109e47;
    }
    if (local_28 == 0x2a) {
      local_2c = -1;
      local_28 = 0x2a;
      iVar4 = local_2c;
      do {
        local_2c = iVar4;
        local_28 = std::istream::get();
        if (local_28 == -1) break;
        iVar4 = local_28;
      } while ((local_2c != 0x2a) || (local_28 != 0x2f));
      goto LAB_00109e47;
    }
    if (local_28 != -1) {
      std::istream::unget();
    }
    local_28 = 0x2f;
LAB_00109f37:
    if (local_28 == -1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)this,"",&local_2d);
      std::allocator<char>::~allocator((allocator<char> *)&local_2d);
    }
    else if (((local_28 == 0x22) || (local_28 == 0x27)) && ((in_RSI->scanStringsFlag & 1U) != 0)) {
      std::istream::unget();
      scanString_abi_cxx11_(this);
    }
    else {
      iVar4 = isdigit(local_28);
      if ((iVar4 == 0) || ((in_RSI->scanNumbersFlag & 1U) == 0)) {
        bVar3 = isWordCharacter(in_RSI,(char)local_28);
        if (bVar3) {
          std::istream::unget();
          scanWord_abi_cxx11_(this);
        }
        else {
          local_3d = 0;
          cVar1 = (char)local_28;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)this,1,cVar1,&local_3e);
          std::allocator<char>::~allocator((allocator<char> *)&local_3e);
          while( true ) {
            std::__cxx11::string::string(local_60,(string *)this);
            bVar3 = isOperatorPrefix(in_RSI,(string *)local_60);
            std::__cxx11::string::~string(local_60);
            if ((!bVar3) || (local_28 = std::istream::get(), local_28 == -1)) break;
            std::__cxx11::string::operator+=((string *)this,(char)local_28);
          }
          while( true ) {
            uVar5 = std::__cxx11::string::length();
            local_c5 = 0;
            if (1 < uVar5) {
              std::__cxx11::string::string(local_80,(string *)this);
              bVar3 = isOperator(in_RSI,(string *)local_80);
              local_c5 = bVar3 ^ 0xff;
              std::__cxx11::string::~string(local_80);
            }
            if ((local_c5 & 1) == 0) break;
            std::istream::unget();
            lVar6 = std::__cxx11::string::length();
            std::__cxx11::string::erase((ulong)this,lVar6 - 1);
          }
        }
      }
      else {
        std::istream::unget();
        scanNumber_abi_cxx11_(this);
      }
    }
  }
  else {
    _ch = in_RSI->savedTokens;
    prev._3_1_ = 0;
    std::__cxx11::string::string((string *)this,(string *)_ch);
    pSVar2 = _ch;
    in_RSI->savedTokens = _ch->link;
    if (_ch != (StringCell *)0x0) {
      StringCell::~StringCell(_ch);
      operator_delete(pSVar2,0x28);
    }
  }
  return this;
}

Assistant:

string TokenScanner::nextToken() {
   if (savedTokens != NULL) {
      StringCell *cp = savedTokens;
      string token = cp->str;
      savedTokens = cp->link;
      delete cp;
      return token;
   }
   while (true) {
      if (ignoreWhitespaceFlag) skipSpaces();
      int ch = isp->get();
      if (ch == '/' && ignoreCommentsFlag) {
         ch = isp->get();
         if (ch == '/') {
            while (true) {
               ch = isp->get();
               if (ch == '\n' || ch == '\r' || ch == EOF) break;
            }
            continue;
         } else if (ch == '*') {
            int prev = EOF;
            while (true) {
               ch = isp->get();
               if (ch == EOF || (prev == '*' && ch == '/')) break;
               prev = ch;
            }
            continue;
         }
         if (ch != EOF) isp->unget();
         ch = '/';
      }
      if (ch == EOF) return "";
      if ((ch == '"' || ch == '\'') && scanStringsFlag) {
         isp->unget();
         return scanString();
      }
      if (isdigit(ch) && scanNumbersFlag) {
         isp->unget();
         return scanNumber();
      }
      if (isWordCharacter(ch)) {
         isp->unget();
         return scanWord();
      }
      string op = string(1, ch);
      while (isOperatorPrefix(op)) {
         ch = isp->get();
         if (ch == EOF) break;
         op += ch;
      }
      while (op.length() > 1 && !isOperator(op)) {
         isp->unget();
         op.erase(op.length() - 1, 1);
      }
      return op;
   }
}